

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModSqrt_test.cpp
# Opt level: O0

void __thiscall
MOD_SQRT_SmallValues_Test::MOD_SQRT_SmallValues_Test(MOD_SQRT_SmallValues_Test *this)

{
  MOD_SQRT_SmallValues_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MOD_SQRT_SmallValues_Test_001a6140;
  return;
}

Assistant:

TEST(MOD_SQRT, SmallValues) {
    auto primes = eratosthenes_sieve(300);
    for(int p : primes) {
        unordered_set<int> sqrtable;
        rep(a,0,p) sqrtable.insert(a*a);
        for(int a : sqrtable) {
            int s = sqrt(a, p);
            EXPECT_EQ((s*s)%p, a % p);
        }
    }
}